

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * Fossilize::pnext_chain_pdf2_skip_ignored_entries(void *pNext)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  
  do {
    if ((int *)pNext == (int *)0x0) {
      return (void *)0x0;
    }
    iVar1 = *pNext;
    bVar3 = false;
    bVar2 = bVar3;
    if (iVar1 < 0x3b9fcb40) {
      if (iVar1 < 0x3b9f2730) {
        if ((iVar1 != 0x3b9ddf10) && (iVar1 != 0x3b9e3cd3)) goto LAB_00130bdd;
      }
      else {
        bVar2 = false;
        if ((iVar1 != 0x3b9f2730) && ((bVar2 = bVar3, iVar1 != 0x3b9f9c62 && (iVar1 != 0x3b9fc371)))
           ) {
LAB_00130bdd:
          pNext = *(void **)((long)pNext + 8);
          bVar2 = true;
        }
      }
    }
    else if (iVar1 < 0x3ba09e30) {
      if ((iVar1 != 0x3b9fcb40) && (iVar1 != 0x3b9fe698)) goto LAB_00130bdd;
    }
    else if ((iVar1 != 0x3ba09e30) && ((iVar1 != 0x3ba0c928 && (iVar1 != 0x3ba224d0))))
    goto LAB_00130bdd;
    if (!bVar2) {
      return pNext;
    }
  } while( true );
}

Assistant:

static const void *pnext_chain_pdf2_skip_ignored_entries(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored;

		switch (base->sType)
		{
		// Robustness tends to affect shader compilation.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		// Affects compilation on NV.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		// Affects compilation on RADV.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		// Workaround: Affects compilation on NV and is causing some awkward cache corruption on some drivers.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		// RADV: Might want to turn off FMASK at some point based on this.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		// RADV uses these :(
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
			ignored = false;
			break;

		default:
			ignored = true;
			break;
		}

		if (ignored)
			pNext = base->pNext;
		else
			break;
	}

	return pNext;
}